

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::ShaderIndexingCase::ShaderIndexingCase
          (ShaderIndexingCase *this,TestContext *testCtx,string *name,string *description,
          bool isVertexCase,ShaderEvalFunc evalFunc,string *vertShaderSource,
          string *fragShaderSource,DataType varType,bool usesArray)

{
  IndexingTestUniformSetup *this_00;
  bool usesArray_local;
  ShaderEvalFunc evalFunc_local;
  bool isVertexCase_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  ShaderIndexingCase *this_local;
  
  this_00 = (IndexingTestUniformSetup *)operator_new(0x18);
  IndexingTestUniformSetup::IndexingTestUniformSetup(this_00,varType,usesArray);
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,name,description,isVertexCase,evalFunc,
             (UniformSetup *)this_00,(AttributeSetupFunc)0x0);
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderIndexingCase_016a8320;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,(string *)vertShaderSource
            );
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,(string *)fragShaderSource
            );
  return;
}

Assistant:

ShaderIndexingCase::ShaderIndexingCase (tcu::TestContext&			testCtx,
										const std::string&			name,
										const std::string&			description,
										const bool					isVertexCase,
										const ShaderEvalFunc		evalFunc,
										const std::string&			vertShaderSource,
										const std::string&			fragShaderSource,
										const DataType				varType,
										const bool					usesArray)
	: ShaderRenderCase(testCtx, name, description, isVertexCase, evalFunc, new IndexingTestUniformSetup(varType, usesArray), DE_NULL)
{
	m_vertShaderSource	= vertShaderSource;
	m_fragShaderSource	= fragShaderSource;
}